

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void inplace_flip_container(roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,uint16_t lb_end)

{
  int iVar1;
  container_t *pcVar2;
  container_t *container_to_flip;
  container_t *flipped_container;
  uint8_t ctype_out;
  uint8_t ctype_in;
  int i;
  uint16_t lb_end_local;
  uint16_t lb_start_local;
  roaring_array_t *prStack_10;
  uint16_t hb_local;
  roaring_array_t *x1_arr_local;
  
  _ctype_out = lb_end;
  i._0_2_ = lb_start;
  i._2_2_ = hb;
  prStack_10 = x1_arr;
  flipped_container._4_4_ = ra_get_index(x1_arr,hb);
  if (flipped_container._4_4_ < 0) {
    pcVar2 = container_range_of_ones
                       ((uint)(uint16_t)i,_ctype_out + 1,(uint8_t *)((long)&flipped_container + 2));
    ra_insert_new_key_value_at
              (prStack_10,-1 - flipped_container._4_4_,i._2_2_,pcVar2,flipped_container._2_1_);
  }
  else {
    pcVar2 = ra_get_container_at_index
                       (prStack_10,(uint16_t)flipped_container._4_4_,
                        (uint8_t *)((long)&flipped_container + 3));
    pcVar2 = container_inot_range
                       (pcVar2,flipped_container._3_1_,(uint)(uint16_t)i,_ctype_out + 1,
                        (uint8_t *)((long)&flipped_container + 2));
    iVar1 = container_get_cardinality(pcVar2,flipped_container._2_1_);
    if (iVar1 == 0) {
      container_free(pcVar2,flipped_container._2_1_);
      ra_remove_at_index(prStack_10,flipped_container._4_4_);
    }
    else {
      ra_set_container_at_index(prStack_10,flipped_container._4_4_,pcVar2,flipped_container._2_1_);
    }
  }
  return;
}

Assistant:

static void inplace_flip_container(roaring_array_t *x1_arr, uint16_t hb,
                                   uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, i, &ctype_in);
        flipped_container = container_inot_range(
            container_to_flip, ctype_in, (uint32_t)lb_start,
            (uint32_t)(lb_end + 1), &ctype_out);
        // if a new container was created, the old one was already freed
        if (container_get_cardinality(flipped_container, ctype_out)) {
            ra_set_container_at_index(x1_arr, i, flipped_container, ctype_out);
        } else {
            container_free(flipped_container, ctype_out);
            ra_remove_at_index(x1_arr, i);
        }

    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(x1_arr, -i - 1, hb, flipped_container,
                                   ctype_out);
    }
}